

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O1

bool __thiscall
duckdb::PartialBlockManager::HasBlockAllocation(PartialBlockManager *this,uint32_t segment_size)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  if (this->max_partial_block_size < segment_size) {
    return false;
  }
  p_Var1 = (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &(this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var3->_M_header;
  if (p_Var1 != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(p_Var1 + 1) >= (ulong)segment_size) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < (ulong)segment_size];
    } while (p_Var1 != (_Base_ptr)0x0);
  }
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

bool PartialBlockManager::HasBlockAllocation(uint32_t segment_size) {
	return segment_size <= max_partial_block_size &&
	       partially_filled_blocks.lower_bound(segment_size) != partially_filled_blocks.end();
}